

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmELF.cxx
# Opt level: O2

uint __thiscall
cmELFInternalImpl<cmELFTypes64>::GetDynamicEntryCount(cmELFInternalImpl<cmELFTypes64> *this)

{
  pointer paVar1;
  bool bVar2;
  uint i;
  uint uVar3;
  ulong uVar4;
  
  bVar2 = LoadDynamicSection(this);
  uVar3 = 0;
  if (bVar2) {
    paVar1 = (this->DynamicSectionEntries).super__Vector_base<Elf64_Dyn,_std::allocator<Elf64_Dyn>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar4 = (long)(this->DynamicSectionEntries).
                  super__Vector_base<Elf64_Dyn,_std::allocator<Elf64_Dyn>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)paVar1 >> 4;
    for (uVar3 = 0; uVar3 < uVar4; uVar3 = uVar3 + 1) {
      if (paVar1[uVar3].d_tag == 0) {
        return uVar3;
      }
    }
    uVar3 = (uint)uVar4;
  }
  return uVar3;
}

Assistant:

unsigned int cmELFInternalImpl<Types>::GetDynamicEntryCount()
{
  if(!this->LoadDynamicSection())
    {
    return 0;
    }
  for(unsigned int i = 0; i < this->DynamicSectionEntries.size(); ++i)
    {
    if(this->DynamicSectionEntries[i].d_tag == DT_NULL)
      {
      return i;
      }
    }
  return static_cast<unsigned int>(this->DynamicSectionEntries.size());
}